

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlackCard.cpp
# Opt level: O1

void __thiscall BlackCard::BlackCard(BlackCard *this,string *n,int t)

{
  pointer pcVar1;
  string local_48;
  
  pcVar1 = (n->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,pcVar1,pcVar1 + n->_M_string_length)
  ;
  Card::Card(&this->super_Card,&local_48,t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (this->super_Card)._vptr_Card = (_func_int **)&PTR_effectBonus_001181b8;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->tapped = false;
  this->revealed = false;
  this->type = t;
  return;
}

Assistant:

BlackCard::BlackCard(string n, int t): Card{n, t}
{
    name = n;

    tapped = false;
    revealed = false;
    type = Type(t);
}